

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint32_t uVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  _Ios_Openmode _Var6;
  ulong uVar7;
  size_t sVar8;
  v_array<int> *this;
  int **ppiVar9;
  wclass *pwVar10;
  ostream *poVar11;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  size_t j;
  uint32_t predicted_class;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  example *in_stack_fffffffffffffce8;
  example *in_stack_fffffffffffffd08;
  string local_278 [32];
  ulong local_258;
  stringstream local_240 [16];
  ostream local_230;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 in_stack_ffffffffffffff70;
  multi_ex *in_stack_ffffffffffffff78;
  example *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  undefined1 is_test;
  vw *all_00;
  vw *local_68;
  ulong local_58;
  float local_4c;
  v_array<COST_SENSITIVE::wclass> local_48;
  undefined8 *local_28;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_28 = (undefined8 *)(in_RSI + 0x6828);
  local_48._begin = (wclass *)*local_28;
  local_48._end = *(wclass **)(in_RSI + 0x6830);
  local_48.end_array = *(wclass **)(in_RSI + 0x6838);
  local_48.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar5 = example_is_newline(in_stack_fffffffffffffce8);
  if ((iVar5 == 0) &&
     (bVar4 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffd08), !bVar4)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    local_4c = 0.0;
    uVar1 = *(uint32_t *)(local_10 + 0x6850);
    uVar7 = (*(code *)PTR_test_label_0048ff70)(local_10 + 0x6828);
    if ((uVar7 & 1) == 0) {
      local_58 = 0;
      while ((sVar8 = v_array<COST_SENSITIVE::wclass>::size(&local_48), local_58 < sVar8 &&
             ((*local_18 & 1) == 0))) {
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_58);
        if (uVar1 == pwVar10->class_index) {
          pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_58);
          local_4c = pwVar10->x;
          *local_18 = 1;
        }
        local_58 = local_58 + 1;
      }
      *(double *)(*local_8 + 0x40) = (double)local_4c + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)local_4c + *(double *)(*local_8 + 0x48);
    }
    this = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar9 = v_array<int>::begin(this);
    local_68 = (vw *)*ppiVar9;
    ppiVar9 = v_array<int>::end(this);
    all_00 = (vw *)*ppiVar9;
    for (; is_test = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18), local_68 != all_00;
        local_68 = (vw *)((long)&local_68->sd + 4)) {
      in_stack_ffffffffffffff8c = *(int *)&local_68->sd;
      local_98 = *(undefined8 *)(local_10 + 0x6878);
      in_stack_ffffffffffffff70 = *(undefined8 *)(local_10 + 0x6880);
      in_stack_ffffffffffffff78 = *(multi_ex **)(local_10 + 0x6888);
      in_stack_ffffffffffffff80 = *(example **)(local_10 + 0x6890);
      (*(code *)local_8[0x6a7])((float)*(uint *)(local_10 + 0x6850),0,in_stack_ffffffffffffff8c);
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_b8);
      _Var6 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_240,local_b8,_Var6);
      local_258 = 0;
      while( true ) {
        uVar7 = local_258;
        sVar8 = v_array<COST_SENSITIVE::wclass>::size(&local_48);
        is_test = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
        if (sVar8 <= uVar7) break;
        if (local_258 != 0) {
          std::operator<<(&local_230,' ');
        }
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_258);
        poVar11 = (ostream *)std::ostream::operator<<(&local_230,pwVar10->class_index);
        poVar11 = std::operator<<(poVar11,':');
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_258);
        std::ostream::operator<<(poVar11,pwVar10->partial_prediction);
        local_258 = local_258 + 1;
      }
      pcVar2 = (code *)local_8[0x6a8];
      lVar3 = local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar2)((int)lVar3,local_278);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::stringstream::~stringstream(local_240);
      std::__cxx11::string::~string(local_b8);
    }
    (*(code *)PTR_test_label_0048ff70)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              (all_00,(bool)is_test,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),(uint32_t)in_stack_ffffffffffffff70
              );
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq)
{
  COST_SENSITIVE::label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec)) return;
  if (COST_SENSITIVE::ec_is_example_header(ec)) return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j=0; j<costs.size(); j++)
    {
      if (hit_loss) break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0) outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    //outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}